

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLProblemBuilderTest_Forward_Test::TestBody(NLProblemBuilderTest_Forward_Test *this)

{
  TestReference value;
  TestReference value_00;
  TestCountExpr value_01;
  StringRef name;
  StringRef name_00;
  StringRef value_02;
  TestCountExpr value_03;
  BasicStringRef<char> value_04;
  BasicStringRef<char> value_05;
  BasicStringRef<char> value_06;
  BasicTestExpr<2> line;
  BasicTestExpr<2> BVar1;
  LogicalExpr LVar2;
  TestExprBuilder<5,_BasicTestExpr<1>_> TVar3;
  PairwiseArgHandler PVar4;
  BasicTestExpr<0> BVar5;
  Expr EVar6;
  MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *this_00;
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *file;
  MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *call;
  MockSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *pMVar7;
  TypedExpectation<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *pTVar8;
  MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *pMVar9;
  TypedExpectation<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *this_01;
  MockSpec<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *pMVar10;
  TypedExpectation<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *pTVar11
  ;
  NLProblemBuilder<MockProblemBuilder> adapter_31;
  StrictMock<MockProblemBuilder> builder_31;
  NLProblemBuilder<MockProblemBuilder> adapter_30;
  StrictMock<MockProblemBuilder> builder_30;
  NLProblemBuilder<MockProblemBuilder> adapter_29;
  StrictMock<MockProblemBuilder> builder_29;
  NLProblemBuilder<MockProblemBuilder> adapter_28;
  StrictMock<MockProblemBuilder> builder_28;
  NLProblemBuilder<MockProblemBuilder> adapter_27;
  StrictMock<MockProblemBuilder> builder_27;
  NLProblemBuilder<MockProblemBuilder> adapter_26;
  StrictMock<MockProblemBuilder> builder_26;
  NLProblemBuilder<MockProblemBuilder> adapter_25;
  StrictMock<MockProblemBuilder> builder_25;
  NLProblemBuilder<MockProblemBuilder> adapter_24;
  StrictMock<MockProblemBuilder> builder_24;
  NLProblemBuilder<MockProblemBuilder> adapter_23;
  StrictMock<MockProblemBuilder> builder_23;
  NLProblemBuilder<MockProblemBuilder> adapter_22;
  StrictMock<MockProblemBuilder> builder_22;
  NLProblemBuilder<MockProblemBuilder> adapter_21;
  StrictMock<MockProblemBuilder> builder_21;
  NLProblemBuilder<MockProblemBuilder> adapter_20;
  StrictMock<MockProblemBuilder> builder_20;
  NLProblemBuilder<MockProblemBuilder> adapter_19;
  StrictMock<MockProblemBuilder> builder_19;
  NLProblemBuilder<MockProblemBuilder> adapter_18;
  StrictMock<MockProblemBuilder> builder_18;
  NLProblemBuilder<MockProblemBuilder> adapter_17;
  StrictMock<MockProblemBuilder> builder_17;
  NLProblemBuilder<MockProblemBuilder> adapter_16;
  StrictMock<MockProblemBuilder> builder_16;
  NLProblemBuilder<MockProblemBuilder> adapter_15;
  StrictMock<MockProblemBuilder> builder_15;
  NLProblemBuilder<MockProblemBuilder> adapter_14;
  StrictMock<MockProblemBuilder> builder_14;
  NLProblemBuilder<MockProblemBuilder> adapter_13;
  StrictMock<MockProblemBuilder> builder_13;
  NLProblemBuilder<MockProblemBuilder> adapter_12;
  StrictMock<MockProblemBuilder> builder_12;
  NLProblemBuilder<MockProblemBuilder> adapter_11;
  StrictMock<MockProblemBuilder> builder_11;
  NLProblemBuilder<MockProblemBuilder> adapter_10;
  StrictMock<MockProblemBuilder> builder_10;
  NLProblemBuilder<MockProblemBuilder> adapter_9;
  StrictMock<MockProblemBuilder> builder_9;
  NLProblemBuilder<MockProblemBuilder> adapter_8;
  StrictMock<MockProblemBuilder> builder_8;
  NLProblemBuilder<MockProblemBuilder> adapter_7;
  StrictMock<MockProblemBuilder> builder_7;
  NLProblemBuilder<MockProblemBuilder> adapter_6;
  StrictMock<MockProblemBuilder> builder_6;
  NLProblemBuilder<MockProblemBuilder> adapter_5;
  StrictMock<MockProblemBuilder> builder_5;
  NLProblemBuilder<MockProblemBuilder> adapter_4;
  StrictMock<MockProblemBuilder> builder_4;
  NLProblemBuilder<MockProblemBuilder> adapter_3;
  StrictMock<MockProblemBuilder> builder_3;
  NLProblemBuilder<MockProblemBuilder> adapter_2;
  StrictMock<MockProblemBuilder> builder_2;
  NLProblemBuilder<MockProblemBuilder> adapter_1;
  StrictMock<MockProblemBuilder> builder_1;
  NLProblemBuilder<MockProblemBuilder> adapter;
  StrictMock<MockProblemBuilder> builder;
  StringRef str;
  TestNumericExpr in_stack_fffffffffffc6488;
  IDType in_stack_fffffffffffc648c;
  BasicTestExpr<0> in_stack_fffffffffffc6490;
  Kind in_stack_fffffffffffc6494;
  CountExpr in_stack_fffffffffffc6498;
  LogicalExpr in_stack_fffffffffffc64a0;
  LogicalExpr condition;
  undefined4 in_stack_fffffffffffc64a4;
  size_t in_stack_fffffffffffc64a8;
  undefined4 in_stack_fffffffffffc64b0;
  undefined4 in_stack_fffffffffffc64b4;
  Matcher<BasicTestExpr<0>_> *in_stack_fffffffffffc64b8;
  Matcher<bool> *in_stack_fffffffffffc64c0;
  TestExprBuilder<5,_BasicTestExpr<1>_> value_07;
  BasicTestExpr<0> value_08;
  Matcher<TestCountExpr> *in_stack_fffffffffffc64c8;
  TestNumericExpr in_stack_fffffffffffc64d0;
  IDType in_stack_fffffffffffc64d4;
  undefined4 in_stack_fffffffffffc64f0;
  undefined4 in_stack_fffffffffffc64f4;
  char *in_stack_fffffffffffc64f8;
  size_t in_stack_fffffffffffc6500;
  Action<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *in_stack_fffffffffffc6508;
  MockProblemBuilder *action;
  undefined4 in_stack_fffffffffffc6510;
  undefined4 in_stack_fffffffffffc6514;
  char *in_stack_fffffffffffc6580;
  char *in_stack_fffffffffffc6588;
  MockProblemBuilder *obj;
  int in_stack_fffffffffffc6594;
  char *in_stack_fffffffffffc6598;
  MockSpec<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *in_stack_fffffffffffc65a0;
  BasicTestExpr<0> BStack_39754;
  BasicTestExpr<0> BStack_39750;
  BasicTestExpr<2> BStack_3974c;
  NLProblemBuilder<MockProblemBuilder> NStack_39748;
  BasicTestExpr<0> BStack_39738;
  BasicTestExpr<0> BStack_39734;
  BasicTestExpr<0> aBStack_3971c [8];
  BasicTestExpr<0> aBStack_396fc [8];
  BasicTestExpr<2> aBStack_396dc [9];
  MockProblemBuilder MStack_396b8;
  IDType IStack_37a6c;
  undefined8 uStack_37a68;
  undefined8 uStack_37a60;
  NLProblemBuilder<MockProblemBuilder> NStack_37a50;
  BasicTestExpr<0> BStack_37a40;
  BasicTestExpr<0> BStack_37a3c;
  undefined8 uStack_37a28;
  undefined8 uStack_37a20;
  MockProblemBuilder MStack_379f8;
  IDType IStack_35db0;
  TestExprBuilder<5,_BasicTestExpr<1>_> TStack_35dac;
  NLProblemBuilder<MockProblemBuilder> NStack_35da8;
  BasicTestExpr<2> BStack_35d98;
  BasicTestExpr<2> BStack_35d94;
  TestExprBuilder<5,_BasicTestExpr<1>_> aTStack_35d7c [9];
  MockProblemBuilder MStack_35d58;
  IDType IStack_3410c;
  NLProblemBuilder<MockProblemBuilder> NStack_34108;
  TestExprBuilder<5,_BasicTestExpr<1>_> TStack_340f8;
  TestExprBuilder<5,_BasicTestExpr<1>_> TStack_340f4;
  MockProblemBuilder MStack_340a8;
  IDType IStack_32460;
  TestExprBuilder<4,_BasicTestExpr<2>_> TStack_3245c;
  NLProblemBuilder<MockProblemBuilder> NStack_32458;
  BasicTestExpr<2> BStack_32448;
  BasicTestExpr<2> BStack_32444;
  TestExprBuilder<4,_BasicTestExpr<2>_> aTStack_3242c [9];
  MockProblemBuilder MStack_32408;
  IDType IStack_307bc;
  NLProblemBuilder<MockProblemBuilder> NStack_307b8;
  TestExprBuilder<4,_BasicTestExpr<2>_> TStack_307a8;
  TestExprBuilder<4,_BasicTestExpr<2>_> TStack_307a4;
  MockProblemBuilder MStack_30758;
  IDType IStack_2eb10;
  BasicTestExpr<2> BStack_2eb0c;
  BasicTestExpr<2> BStack_2eb08;
  BasicTestExpr<2> BStack_2eb04;
  NLProblemBuilder<MockProblemBuilder> NStack_2eb00;
  BasicTestExpr<2> BStack_2eaf0;
  BasicTestExpr<2> BStack_2eaec;
  BasicTestExpr<2> aBStack_2ead4 [8];
  BasicTestExpr<2> aBStack_2eab4 [8];
  BasicTestExpr<2> aBStack_2ea94 [9];
  MockProblemBuilder MStack_2ea70;
  IDType IStack_2ce28;
  BasicTestExpr<1> BStack_2ce1c;
  NLProblemBuilder<MockProblemBuilder> NStack_2ce18;
  BasicTestExpr<2> BStack_2ce08;
  BasicTestExpr<2> BStack_2ce04;
  BasicTestExpr<1> aBStack_2cdcc [15];
  MockProblemBuilder MStack_2cd90;
  IDType IStack_2b144;
  BasicTestExpr<1> BStack_2b140;
  BasicTestExpr<1> BStack_2b13c;
  NLProblemBuilder<MockProblemBuilder> NStack_2b138;
  BasicTestExpr<2> BStack_2b128;
  BasicTestExpr<2> BStack_2b124;
  BasicTestExpr<1> aBStack_2b10c [8];
  BasicTestExpr<1> aBStack_2b0ec [15];
  MockProblemBuilder MStack_2b0b0;
  IDType IStack_29464;
  BasicTestExpr<2> BStack_29460;
  BasicTestExpr<2> BStack_2945c;
  NLProblemBuilder<MockProblemBuilder> NStack_29458;
  BasicTestExpr<2> BStack_29448;
  BasicTestExpr<2> BStack_29444;
  BasicTestExpr<2> aBStack_2942c [8];
  BasicTestExpr<2> aBStack_2940c [15];
  MockProblemBuilder MStack_293d0;
  IDType IStack_27788;
  BasicTestExpr<2> BStack_27784;
  NLProblemBuilder<MockProblemBuilder> NStack_27780;
  BasicTestExpr<2> BStack_27770;
  BasicTestExpr<2> BStack_2776c;
  BasicTestExpr<2> aBStack_27754 [9];
  MockProblemBuilder MStack_27730;
  IDType IStack_25ae4;
  NLProblemBuilder<MockProblemBuilder> NStack_25ae0;
  BasicTestExpr<2> BStack_25ad0;
  BasicTestExpr<2> BStack_25acc;
  MockProblemBuilder MStack_25a98;
  CountExpr CStack_23e4c;
  TestExprBuilder<3,_BasicTestExpr<2>_> TStack_23e44;
  NLProblemBuilder<MockProblemBuilder> NStack_23e40;
  TestCountExpr TStack_23e28;
  TestExprBuilder<3,_BasicTestExpr<2>_> aTStack_23e0c [9];
  MockProblemBuilder MStack_23de8;
  IDType IStack_2219c;
  NLProblemBuilder<MockProblemBuilder> NStack_22198;
  TestExprBuilder<3,_BasicTestExpr<2>_> TStack_22188;
  TestExprBuilder<3,_BasicTestExpr<2>_> TStack_22184;
  MockProblemBuilder MStack_22150;
  IDType IStack_20508;
  TestExprBuilder<0,_BasicTestExpr<0>_> TStack_20504;
  NLProblemBuilder<MockProblemBuilder> NStack_20500;
  BasicTestExpr<1> BStack_204f0;
  BasicTestExpr<1> BStack_204ec;
  TestExprBuilder<0,_BasicTestExpr<0>_> aTStack_204d4 [9];
  MockProblemBuilder MStack_204b0;
  IDType IStack_1e868;
  BasicTestExpr<0> BStack_1e864;
  NLProblemBuilder<MockProblemBuilder> NStack_1e860;
  TestExprBuilder<0,_BasicTestExpr<0>_> TStack_1e850;
  TestExprBuilder<0,_BasicTestExpr<0>_> TStack_1e84c;
  BasicTestExpr<0> aBStack_1e834 [15];
  MockProblemBuilder MStack_1e7f8;
  IDType IStack_1cbb0;
  TestExprBuilder<2,_BasicTestExpr<1>_> TStack_1cbac;
  NLProblemBuilder<MockProblemBuilder> NStack_1cba8;
  BasicTestExpr<1> BStack_1cb98;
  BasicTestExpr<1> BStack_1cb94;
  TestExprBuilder<2,_BasicTestExpr<1>_> aTStack_1cb7c [9];
  MockProblemBuilder MStack_1cb58;
  IDType IStack_1af10;
  BasicTestExpr<1> BStack_1af0c;
  NLProblemBuilder<MockProblemBuilder> NStack_1af08;
  TestExprBuilder<2,_BasicTestExpr<1>_> TStack_1aef8;
  TestExprBuilder<2,_BasicTestExpr<1>_> TStack_1aef4;
  BasicTestExpr<1> aBStack_1aedc [15];
  MockProblemBuilder MStack_1aea0;
  IDType IStack_19258;
  TestExprBuilder<1,_BasicTestExpr<1>_> TStack_19254;
  NLProblemBuilder<MockProblemBuilder> NStack_19250;
  BasicTestExpr<1> BStack_19240;
  BasicTestExpr<1> BStack_1923c;
  TestExprBuilder<1,_BasicTestExpr<1>_> aTStack_19224 [9];
  MockProblemBuilder MStack_19200;
  IDType IStack_175b4;
  NLProblemBuilder<MockProblemBuilder> NStack_175b0;
  TestExprBuilder<1,_BasicTestExpr<1>_> TStack_175a0;
  TestExprBuilder<1,_BasicTestExpr<1>_> TStack_1759c;
  MockProblemBuilder MStack_17568;
  IDType IStack_15920;
  TestExprBuilder<1,_BasicTestExpr<1>_> TStack_1591c;
  NLProblemBuilder<MockProblemBuilder> NStack_15918;
  BasicTestExpr<1> BStack_15908;
  BasicTestExpr<1> BStack_15904;
  TestExprBuilder<1,_BasicTestExpr<1>_> aTStack_158ec [9];
  MockProblemBuilder MStack_158c8;
  IDType IStack_13c7c;
  NLProblemBuilder<MockProblemBuilder> NStack_13c78;
  TestExprBuilder<1,_BasicTestExpr<1>_> TStack_13c68;
  TestExprBuilder<1,_BasicTestExpr<1>_> TStack_13c64;
  MockProblemBuilder MStack_13c18;
  IDType IStack_11fd0;
  TestPLTermBuilder TStack_11fc4;
  NLProblemBuilder<MockProblemBuilder> NStack_11fc0;
  BasicTestExpr<1> BStack_11fb0;
  BasicTestExpr<1> BStack_11fac;
  undefined4 uStack_11f94;
  undefined4 uStack_11f8c;
  TestPLTermBuilder aTStack_11f6c [9];
  MockProblemBuilder MStack_11f48;
  IDType IStack_102fc;
  NLProblemBuilder<MockProblemBuilder> NStack_102f8;
  TestPLTermBuilder TStack_102e8;
  TestPLTermBuilder TStack_102e4;
  MockProblemBuilder MStack_102b0;
  IDType local_e668;
  BasicTestExpr<1> local_e664;
  BasicTestExpr<1> local_e660;
  BasicTestExpr<2> local_e65c;
  NLProblemBuilder<MockProblemBuilder> local_e658;
  BasicTestExpr<1> local_e648;
  BasicTestExpr<1> local_e644;
  BasicTestExpr<1> local_e62c [8];
  BasicTestExpr<1> local_e60c [8];
  BasicTestExpr<2> local_e5ec [9];
  MockProblemBuilder local_e5c8;
  IDType local_c97c;
  BasicTestExpr<1> local_c978;
  BasicTestExpr<1> local_c974;
  NLProblemBuilder<MockProblemBuilder> local_c970;
  BasicTestExpr<1> local_c960;
  BasicTestExpr<1> local_c95c;
  BasicTestExpr<1> local_c944 [8];
  BasicTestExpr<1> local_c924 [15];
  MockProblemBuilder local_c8e8;
  IDType local_aca0;
  BasicTestExpr<1> local_ac9c;
  NLProblemBuilder<MockProblemBuilder> local_ac98;
  BasicTestExpr<1> local_ac88;
  BasicTestExpr<1> local_ac84;
  BasicTestExpr<1> local_ac6c [15];
  MockProblemBuilder local_ac30;
  Reference local_8fe8;
  NLProblemBuilder<MockProblemBuilder> local_8fe0;
  TestReference local_8fc8;
  MockProblemBuilder local_8f90;
  Reference local_7348;
  NLProblemBuilder<MockProblemBuilder> local_7340;
  TestReference local_7328;
  MockProblemBuilder local_72f0;
  IDType local_56a4;
  NLProblemBuilder<MockProblemBuilder> local_56a0;
  BasicTestExpr<1> local_5690;
  BasicTestExpr<1> local_568c;
  MockProblemBuilder local_5658;
  IDType local_3a0c;
  undefined8 local_3a08;
  undefined8 uStack_3a00;
  NLProblemBuilder<MockProblemBuilder> local_39f0;
  TestSuffixHandler<1> local_39e0;
  TestSuffixHandler<1> local_39dc;
  undefined8 local_3998;
  undefined8 uStack_3990;
  MockProblemBuilder local_3968;
  IDType local_1d1c;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  NLProblemBuilder<MockProblemBuilder> local_1d00;
  TestSuffixHandler<0> local_1cf0;
  TestSuffixHandler<0> local_1cec;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  MockProblemBuilder local_1c60;
  undefined8 local_18;
  undefined8 uStack_10;
  
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             (char *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  local_1c98 = local_18;
  uStack_1c90 = uStack_10;
  value_04.size_ = in_stack_fffffffffffc6500;
  value_04.data_ = in_stack_fffffffffffc64f8;
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)
             CONCAT44(in_stack_fffffffffffc64f4,in_stack_fffffffffffc64f0),value_04);
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_AddIntSuffix
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<fmt::BasicStringRef<char>_> *)in_stack_fffffffffffc6498,
             (Matcher<int> *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             (Matcher<int> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::
  InternalExpectedAt(in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  TestSuffixHandler<0>::TestSuffixHandler(&local_1cf0,ID);
  local_1cec.id_ = (IDType)testing::Return<TestSuffixHandler<0>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestSuffixHandler<0>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::
  WillOnce((TypedExpectation<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)
           in_stack_fffffffffffc6508);
  testing::Action<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)>::~Action
            ((Action<TestSuffixHandler<0>_(fmt::BasicStringRef<char>,_int,_int)> *)0x178c39);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x178c46);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x178c53);
  testing::Matcher<fmt::BasicStringRef<char>_>::~Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)0x178c60);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&local_1d00,&local_1c60);
  local_1d18 = local_18;
  uStack_1d10 = uStack_10;
  name.data_._4_4_ = in_stack_fffffffffffc64a4;
  name.data_._0_4_ = in_stack_fffffffffffc64a0.id_;
  name.size_ = in_stack_fffffffffffc64a8;
  local_1d1c = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnIntSuffix
                                 ((NLProblemBuilder<MockProblemBuilder> *)in_stack_fffffffffffc6498,
                                  name,in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&local_1d00);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  local_3998 = local_18;
  uStack_3990 = uStack_10;
  value_05.size_ = in_stack_fffffffffffc6500;
  value_05.data_ = in_stack_fffffffffffc64f8;
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)
             CONCAT44(in_stack_fffffffffffc64f4,in_stack_fffffffffffc64f0),value_05);
  testing::Matcher<mp::suf::Kind>::Matcher
            ((Matcher<mp::suf::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_AddDblSuffix
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<fmt::BasicStringRef<char>_> *)in_stack_fffffffffffc6498,
             (Matcher<mp::suf::Kind> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             (Matcher<int> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
  ::InternalExpectedAt
            ((MockSpec<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *)
             in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
             in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  TestSuffixHandler<1>::TestSuffixHandler(&local_39e0,ID);
  local_39dc.id_ = (IDType)testing::Return<TestSuffixHandler<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestSuffixHandler<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::
  TypedExpectation<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::WillOnce
            ((TypedExpectation<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>
              *)CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *)
             in_stack_fffffffffffc6508);
  testing::Action<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)>::~Action
            ((Action<TestSuffixHandler<1>_(fmt::BasicStringRef<char>,_mp::suf::Kind,_int)> *)
             0x178e26);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x178e33);
  testing::Matcher<mp::suf::Kind>::~Matcher((Matcher<mp::suf::Kind> *)0x178e40);
  testing::Matcher<fmt::BasicStringRef<char>_>::~Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)0x178e4d);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&local_39f0,&local_3968);
  local_3a08 = local_18;
  uStack_3a00 = uStack_10;
  name_00.data_._4_4_ = in_stack_fffffffffffc64a4;
  name_00.data_._0_4_ = in_stack_fffffffffffc64a0.id_;
  name_00.size_ = in_stack_fffffffffffc64a8;
  local_3a0c = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnDblSuffix
                                 ((NLProblemBuilder<MockProblemBuilder> *)in_stack_fffffffffffc6498,
                                  name_00,in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&local_39f0);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<double>::Matcher
            ((Matcher<double> *)CONCAT44(in_stack_fffffffffffc64d4,in_stack_fffffffffffc64d0.id_),
             (double)in_stack_fffffffffffc64c8);
  MockProblemBuilder::gmock_MakeNumericConstant
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<double> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<1>_(double)>::InternalExpectedAt
            ((MockSpec<BasicTestExpr<1>_(double)> *)in_stack_fffffffffffc65a0,
             in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,
             in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&local_5690,ID);
  local_568c.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(double)>::WillOnce
            ((TypedExpectation<BasicTestExpr<1>_(double)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<BasicTestExpr<1>_(double)> *)in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(double)>::~Action((Action<BasicTestExpr<1>_(double)> *)0x178fc3)
  ;
  testing::Matcher<double>::~Matcher((Matcher<double> *)0x178fd0);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&local_56a0,&local_5658);
  local_56a4 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnNumber
                                 ((NLProblemBuilder<MockProblemBuilder> *)
                                  CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_),
                                  7.62930241520303e-318);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&local_56a0);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_MakeVariable
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<int> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<TestReference_(int)>::InternalExpectedAt
            ((MockSpec<TestReference_(int)> *)in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,
             in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  TestReference::TestReference
            ((TestReference *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             in_stack_fffffffffffc648c);
  value.id_ = in_stack_fffffffffffc648c;
  value.super_TestNumericExpr.id_ = in_stack_fffffffffffc6488.id_;
  local_7328 = (TestReference)testing::Return<TestReference>(value);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestReference> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestReference_(int)>::WillOnce
            ((TypedExpectation<TestReference_(int)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<TestReference_(int)> *)in_stack_fffffffffffc6508);
  testing::Action<TestReference_(int)>::~Action((Action<TestReference_(int)> *)0x179124);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x179131);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&local_7340,&local_72f0);
  local_7348 = mp::internal::NLProblemBuilder<MockProblemBuilder>::OnVariableRef
                         ((NLProblemBuilder<MockProblemBuilder> *)
                          CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_),0);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&local_7340);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_MakeCommonExpr
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<int> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<TestReference_(int)>::InternalExpectedAt
            ((MockSpec<TestReference_(int)> *)in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,
             in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  TestReference::TestReference
            ((TestReference *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             in_stack_fffffffffffc648c);
  value_00.id_ = in_stack_fffffffffffc648c;
  value_00.super_TestNumericExpr.id_ = in_stack_fffffffffffc6488.id_;
  local_8fc8 = (TestReference)testing::Return<TestReference>(value_00);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestReference> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestReference_(int)>::WillOnce
            ((TypedExpectation<TestReference_(int)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<TestReference_(int)> *)in_stack_fffffffffffc6508);
  testing::Action<TestReference_(int)>::~Action((Action<TestReference_(int)> *)0x179285);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x179292);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&local_8fe0,&local_8f90);
  local_8fe8 = mp::internal::NLProblemBuilder<MockProblemBuilder>::OnCommonExprRef
                         ((NLProblemBuilder<MockProblemBuilder> *)
                          CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_),0);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&local_8fe0);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(local_ac6c,ID);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_MakeUnary
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<mp::expr::Kind> *)in_stack_fffffffffffc6498,
             (Matcher<BasicTestExpr<1>_> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::internal::MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&local_ac88,ID2);
  local_ac84.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::WillOnce
            ((TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)
             in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)>::~Action
            ((Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>)> *)0x179414);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x179421);
  testing::Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x17942e);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&local_ac98,&local_ac30);
  BasicTestExpr<1>::BasicTestExpr(&local_ac9c,ID);
  local_aca0 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnUnary
                                 ((NLProblemBuilder<MockProblemBuilder> *)
                                  CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_),
                                  UNKNOWN,in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&local_ac98);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(local_c924,ID);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(local_c944,ID2);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_MakeBinary
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<mp::expr::Kind> *)in_stack_fffffffffffc6498,
             (Matcher<BasicTestExpr<1>_> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             (Matcher<BasicTestExpr<1>_> *)
             CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
  ::InternalExpectedAt
            ((MockSpec<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *)
             in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
             in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&local_c960,ID3);
  local_c95c.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::
  TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::WillOnce
            ((TypedExpectation<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
              *)CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *)
             in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::~Action
            ((Action<BasicTestExpr<1>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *)
             0x1795fa);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x179607);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x179614);
  testing::Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x179621);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&local_c970,&local_c8e8);
  BasicTestExpr<1>::BasicTestExpr(&local_c974,ID);
  BasicTestExpr<1>::BasicTestExpr(&local_c978,ID2);
  local_c97c = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnBinary
                                 ((NLProblemBuilder<MockProblemBuilder> *)
                                  CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
                                  in_stack_fffffffffffc648c,in_stack_fffffffffffc64a0.id_,
                                  (NumericExpr)in_stack_fffffffffffc6498.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&local_c970);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  BasicTestExpr<2>::BasicTestExpr(local_e5ec,ID);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<2>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(local_e60c,ID2);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(local_e62c,ID3);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_MakeIf
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc6498,
             (Matcher<BasicTestExpr<1>_> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             (Matcher<BasicTestExpr<1>_> *)
             CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::
  MockSpec<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
                      *)in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,
                     in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&local_e648,ID4);
  local_e644.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::
  TypedExpectation<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
  WillOnce((TypedExpectation<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>
            *)CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)> *)
           in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)>::~Action
            ((Action<BasicTestExpr<1>_(BasicTestExpr<2>,_BasicTestExpr<1>,_BasicTestExpr<1>)> *)
             0x17981e);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x17982b);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x179838);
  testing::Matcher<BasicTestExpr<2>_>::~Matcher((Matcher<BasicTestExpr<2>_> *)0x179845);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&local_e658,&local_e5c8);
  BasicTestExpr<2>::BasicTestExpr(&local_e65c,ID);
  BasicTestExpr<1>::BasicTestExpr(&local_e660,ID2);
  BasicTestExpr<1>::BasicTestExpr(&local_e664,ID3);
  local_e668 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnIf
                                 ((NLProblemBuilder<MockProblemBuilder> *)
                                  CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
                                  in_stack_fffffffffffc64a0,
                                  (NumericExpr)in_stack_fffffffffffc6498.id_,
                                  (IDType)in_stack_fffffffffffc6498.super_TestNumericExpr.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&local_e658);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_BeginPLTerm
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<int> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<TestPLTermBuilder_(int)>::InternalExpectedAt
            ((MockSpec<TestPLTermBuilder_(int)> *)in_stack_fffffffffffc65a0,
             in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,
             in_stack_fffffffffffc6580);
  TestPLTermBuilder::TestPLTermBuilder(&TStack_102e8,ID);
  TStack_102e4.id_ = (IDType)testing::Return<TestPLTermBuilder>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestPLTermBuilder> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestPLTermBuilder_(int)>::WillOnce
            ((TypedExpectation<TestPLTermBuilder_(int)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<TestPLTermBuilder_(int)> *)in_stack_fffffffffffc6508);
  testing::Action<TestPLTermBuilder_(int)>::~Action((Action<TestPLTermBuilder_(int)> *)0x1799de);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x1799eb);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_102f8,&MStack_102b0);
  IStack_102fc = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginPLTerm
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),0);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_102f8);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  TestPLTermBuilder::TestPLTermBuilder(aTStack_11f6c,ID);
  testing::Matcher<TestPLTermBuilder>::Matcher
            ((Matcher<TestPLTermBuilder> *)in_stack_fffffffffffc64b8,
             (TestPLTermBuilder)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  TestReference::TestReference
            ((TestReference *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             in_stack_fffffffffffc648c);
  uStack_11f8c = uStack_11f94;
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_EndPLTerm
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<TestPLTermBuilder> *)in_stack_fffffffffffc6498,
             (Matcher<BasicTestExpr<1>_> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::internal::MockSpec<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&BStack_11fb0,ID3);
  BStack_11fac.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::
  WillOnce((TypedExpectation<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *)
           in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)>::~Action
            ((Action<BasicTestExpr<1>_(TestPLTermBuilder,_BasicTestExpr<1>)> *)0x179b8e);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x179b9b);
  testing::Matcher<TestPLTermBuilder>::~Matcher((Matcher<TestPLTermBuilder> *)0x179ba8);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_11fc0,&MStack_11f48);
  TestPLTermBuilder::TestPLTermBuilder(&TStack_11fc4,ID);
  TestReference::TestReference
            ((TestReference *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             in_stack_fffffffffffc648c);
  IStack_11fd0 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::EndPLTerm
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_
                                            ),in_stack_fffffffffffc64a0.id_,
                                    (Reference)in_stack_fffffffffffc6498);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_11fc0);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_BeginIterated
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<mp::expr::Kind> *)in_stack_fffffffffffc6498,
             (Matcher<int> *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::internal::MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  InternalExpectedAt((MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  TestExprBuilder<1,_BasicTestExpr<1>_>::TestExprBuilder(&TStack_13c68,ID);
  TStack_13c64.id_ =
       (IDType)testing::Return<TestExprBuilder<1,BasicTestExpr<1>>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  WillOnce((TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
           in_stack_fffffffffffc6508);
  testing::Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::~Action
            ((Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)0x179d43);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x179d50);
  testing::Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x179d5d);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_13c78,&MStack_13c18);
  IStack_13c7c = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginVarArg
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),UNKNOWN,0x179d8b);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_13c78);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  TestExprBuilder<1,_BasicTestExpr<1>_>::TestExprBuilder(aTStack_158ec,ID);
  testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)in_stack_fffffffffffc64b8,
             (TestExprBuilder<1,_BasicTestExpr<1>_>)
             (IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_EndIterated
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)
              CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&BStack_15908,ID2);
  BStack_15904.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  WillOnce((TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)
           in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::~Action
            ((Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)0x179ec5);
  testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>::~Matcher
            ((Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)0x179ed2);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_15918,&MStack_158c8);
  TestExprBuilder<1,_BasicTestExpr<1>_>::TestExprBuilder(&TStack_1591c,ID);
  IStack_15920 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::EndVarArg
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_15918);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_BeginSum
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<int> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::InternalExpectedAt
            ((MockSpec<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)in_stack_fffffffffffc65a0,
             in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,
             in_stack_fffffffffffc6580);
  TestExprBuilder<1,_BasicTestExpr<1>_>::TestExprBuilder(&TStack_175a0,ID);
  TStack_1759c.id_ =
       (IDType)testing::Return<TestExprBuilder<1,BasicTestExpr<1>>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::WillOnce
            ((TypedExpectation<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)in_stack_fffffffffffc6508);
  testing::Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)>::~Action
            ((Action<TestExprBuilder<1,_BasicTestExpr<1>_>_(int)> *)0x17a035);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x17a042);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_175b0,&MStack_17568);
  IStack_175b4 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginSum
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),0);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_175b0);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  TestExprBuilder<1,_BasicTestExpr<1>_>::TestExprBuilder(aTStack_19224,ID);
  testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)in_stack_fffffffffffc64b8,
             (TestExprBuilder<1,_BasicTestExpr<1>_>)
             (IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_EndSum
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)
              CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&BStack_19240,ID2);
  BStack_1923c.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
  WillOnce((TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)
           in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::~Action
            ((Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)0x17a1a5);
  testing::Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_>::~Matcher
            ((Matcher<TestExprBuilder<1,_BasicTestExpr<1>_>_> *)0x17a1b2);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_19250,&MStack_19200);
  TestExprBuilder<1,_BasicTestExpr<1>_>::TestExprBuilder(&TStack_19254,ID);
  IStack_19258 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::EndSum
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_19250);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(aBStack_1aedc,ID);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_BeginNumberOf
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<int> *)in_stack_fffffffffffc6498,
             (Matcher<BasicTestExpr<1>_> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::internal::MockSpec<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>::
  InternalExpectedAt((MockSpec<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  TestExprBuilder<2,_BasicTestExpr<1>_>::TestExprBuilder(&TStack_1aef8,ID2);
  TStack_1aef4.id_ =
       (IDType)testing::Return<TestExprBuilder<2,BasicTestExpr<1>>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>
  ::WillOnce((TypedExpectation<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *)
             in_stack_fffffffffffc6508);
  testing::Action<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)>::~Action
            ((Action<TestExprBuilder<2,_BasicTestExpr<1>_>_(int,_BasicTestExpr<1>)> *)0x17a347);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x17a354);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x17a361);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_1af08,&MStack_1aea0);
  BasicTestExpr<1>::BasicTestExpr(&BStack_1af0c,ID);
  IStack_1af10 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginNumberOf
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),0,in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_1af08);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  TestExprBuilder<2,_BasicTestExpr<1>_>::TestExprBuilder(aTStack_1cb7c,ID);
  testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)in_stack_fffffffffffc64b8,
             (TestExprBuilder<2,_BasicTestExpr<1>_>)
             (IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_EndNumberOf
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)
              CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&BStack_1cb98,ID2);
  BStack_1cb94.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::
  WillOnce((TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *)
           in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)>::~Action
            ((Action<BasicTestExpr<1>_(TestExprBuilder<2,_BasicTestExpr<1>_>)> *)0x17a4df);
  testing::Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_>::~Matcher
            ((Matcher<TestExprBuilder<2,_BasicTestExpr<1>_>_> *)0x17a4ec);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_1cba8,&MStack_1cb58);
  TestExprBuilder<2,_BasicTestExpr<1>_>::TestExprBuilder(&TStack_1cbac,ID);
  IStack_1cbb0 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::EndNumberOf
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_1cba8);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  BasicTestExpr<0>::BasicTestExpr(aBStack_1e834,ID);
  testing::Matcher<BasicTestExpr<0>_>::Matcher
            (in_stack_fffffffffffc64b8,
             (BasicTestExpr<0>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_BeginSymbolicNumberOf
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<int> *)in_stack_fffffffffffc6498,
             (Matcher<BasicTestExpr<0>_> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::internal::MockSpec<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>::
  InternalExpectedAt((MockSpec<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  TestExprBuilder<0,_BasicTestExpr<0>_>::TestExprBuilder(&TStack_1e850,ID2);
  TStack_1e84c.id_ =
       (IDType)testing::Return<TestExprBuilder<0,BasicTestExpr<0>>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>
  ::WillOnce((TypedExpectation<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *)
             in_stack_fffffffffffc6508);
  testing::Action<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)>::~Action
            ((Action<TestExprBuilder<0,_BasicTestExpr<0>_>_(int,_BasicTestExpr<0>)> *)0x17a681);
  testing::Matcher<BasicTestExpr<0>_>::~Matcher((Matcher<BasicTestExpr<0>_> *)0x17a68e);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x17a69b);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_1e860,&MStack_1e7f8);
  BasicTestExpr<0>::BasicTestExpr(&BStack_1e864,ID);
  IStack_1e868 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginSymbolicNumberOf
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),0,in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_1e860);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  TestExprBuilder<0,_BasicTestExpr<0>_>::TestExprBuilder(aTStack_204d4,ID);
  testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>::Matcher
            ((Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)in_stack_fffffffffffc64b8,
             (TestExprBuilder<0,_BasicTestExpr<0>_>)
             (IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_EndSymbolicNumberOf
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)
              CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<1>::BasicTestExpr(&BStack_204f0,ID2);
  BStack_204ec.id_ = (IDType)testing::Return<BasicTestExpr<1>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
  WillOnce((TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *)
           in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::~Action
            ((Action<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *)0x17a819);
  testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>::~Matcher
            ((Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)0x17a826);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_20500,&MStack_204b0);
  TestExprBuilder<0,_BasicTestExpr<0>_>::TestExprBuilder(&TStack_20504,ID);
  IStack_20508 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::EndSymbolicNumberOf
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_20500);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_BeginCount
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<int> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::InternalExpectedAt
            ((MockSpec<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *)in_stack_fffffffffffc65a0,
             in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,
             in_stack_fffffffffffc6580);
  TestExprBuilder<3,_BasicTestExpr<2>_>::TestExprBuilder(&TStack_22188,ID);
  TStack_22184.id_ =
       (IDType)testing::Return<TestExprBuilder<3,BasicTestExpr<2>>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::WillOnce
            ((TypedExpectation<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *)in_stack_fffffffffffc6508);
  testing::Action<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::~Action
            ((Action<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *)0x17a989);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x17a996);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_22198,&MStack_22150);
  IStack_2219c = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginCount
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),0);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_22198);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  TestExprBuilder<3,_BasicTestExpr<2>_>::TestExprBuilder(aTStack_23e0c,ID);
  testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>::Matcher
            ((Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)in_stack_fffffffffffc64b8,
             (TestExprBuilder<3,_BasicTestExpr<2>_>)
             (IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_EndCount
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)
              CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
  InternalExpectedAt((MockSpec<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)
                     in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                     in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  TestCountExpr::TestCountExpr
            ((TestCountExpr *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             in_stack_fffffffffffc648c);
  value_01.id_ = in_stack_fffffffffffc648c;
  value_01.super_TestNumericExpr.id_ = in_stack_fffffffffffc6488.id_;
  TStack_23e28 = (TestCountExpr)testing::Return<TestCountExpr>(value_01);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestCountExpr> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
  WillOnce((TypedExpectation<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)
           in_stack_fffffffffffc6508);
  testing::Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::~Action
            ((Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)0x17aafd);
  testing::Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_>::~Matcher
            ((Matcher<TestExprBuilder<3,_BasicTestExpr<2>_>_> *)0x17ab0a);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_23e40,&MStack_23de8);
  TestExprBuilder<3,_BasicTestExpr<2>_>::TestExprBuilder(&TStack_23e44,ID);
  CStack_23e4c = mp::internal::NLProblemBuilder<MockProblemBuilder>::EndCount
                           ((NLProblemBuilder<MockProblemBuilder> *)
                            CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
                            (CountArgHandler)in_stack_fffffffffffc6498.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_23e40);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<bool>::Matcher
            (in_stack_fffffffffffc64c0,SUB81((ulong)in_stack_fffffffffffc64b8 >> 0x38,0));
  MockProblemBuilder::gmock_MakeLogicalConstant
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<bool> *)CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<2>_(bool)>::InternalExpectedAt
            ((MockSpec<BasicTestExpr<2>_(bool)> *)in_stack_fffffffffffc65a0,
             in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,
             in_stack_fffffffffffc6580);
  BasicTestExpr<2>::BasicTestExpr(&BStack_25ad0,ID);
  BStack_25acc.id_ = (IDType)testing::Return<BasicTestExpr<2>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<2>_(bool)>::WillOnce
            ((TypedExpectation<BasicTestExpr<2>_(bool)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<BasicTestExpr<2>_(bool)> *)in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<2>_(bool)>::~Action((Action<BasicTestExpr<2>_(bool)> *)0x17ac70);
  testing::Matcher<bool>::~Matcher((Matcher<bool> *)0x17ac7d);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_25ae0,&MStack_25a98);
  IStack_25ae4 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnBool
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),false);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_25ae0);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  BasicTestExpr<2>::BasicTestExpr(aBStack_27754,ID);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<2>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_MakeNot
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<BasicTestExpr<2>_> *)
              CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)>::InternalExpectedAt
            ((MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>)> *)in_stack_fffffffffffc65a0,
             in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,in_stack_fffffffffffc6588,
             in_stack_fffffffffffc6580);
  BasicTestExpr<2>::BasicTestExpr(&BStack_27770,ID2);
  BStack_2776c.id_ = (IDType)testing::Return<BasicTestExpr<2>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>)>::WillOnce
            ((TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>)> *)
             CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<BasicTestExpr<2>_(BasicTestExpr<2>)> *)in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<2>_(BasicTestExpr<2>)>::~Action
            ((Action<BasicTestExpr<2>_(BasicTestExpr<2>)> *)0x17ade0);
  testing::Matcher<BasicTestExpr<2>_>::~Matcher((Matcher<BasicTestExpr<2>_> *)0x17aded);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_27780,&MStack_27730);
  BasicTestExpr<2>::BasicTestExpr(&BStack_27784,ID);
  IStack_27788 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnNot
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_27780);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  BasicTestExpr<2>::BasicTestExpr(aBStack_2940c,ID);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<2>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  BasicTestExpr<2>::BasicTestExpr(aBStack_2942c,ID2);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<2>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_MakeBinaryLogical
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<mp::expr::Kind> *)in_stack_fffffffffffc6498,
             (Matcher<BasicTestExpr<2>_> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             (Matcher<BasicTestExpr<2>_> *)
             CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
  ::InternalExpectedAt
            ((MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)> *)
             in_stack_fffffffffffc65a0,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
             in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<2>::BasicTestExpr(&BStack_29448,ID3);
  BStack_29444.id_ = (IDType)testing::Return<BasicTestExpr<2>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8);
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::WillOnce
            ((TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>
              *)CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)> *)
             in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)>::~Action
            ((Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<2>,_BasicTestExpr<2>)> *)
             0x17afb4);
  testing::Matcher<BasicTestExpr<2>_>::~Matcher((Matcher<BasicTestExpr<2>_> *)0x17afc1);
  testing::Matcher<BasicTestExpr<2>_>::~Matcher((Matcher<BasicTestExpr<2>_> *)0x17afce);
  testing::Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x17afdb);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_29458,&MStack_293d0);
  BasicTestExpr<2>::BasicTestExpr(&BStack_2945c,ID);
  BasicTestExpr<2>::BasicTestExpr(&BStack_29460,ID2);
  IStack_29464 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnBinaryLogical
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_
                                            ),in_stack_fffffffffffc648c,in_stack_fffffffffffc64a0,
                                    (LogicalExpr)in_stack_fffffffffffc6498.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_29458);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(aBStack_2b0ec,ID);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(aBStack_2b10c,ID2);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  this_00 = MockProblemBuilder::gmock_MakeRelational
                      ((MockProblemBuilder *)
                       CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_),
                       (Matcher<mp::expr::Kind> *)in_stack_fffffffffffc6498,
                       (Matcher<BasicTestExpr<1>_> *)
                       CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
                       (Matcher<BasicTestExpr<1>_> *)
                       CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  file = testing::internal::
         MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::
         InternalExpectedAt(this_00,in_stack_fffffffffffc6598,in_stack_fffffffffffc6594,
                            in_stack_fffffffffffc6588,in_stack_fffffffffffc6580);
  BasicTestExpr<2>::BasicTestExpr(&BStack_2b128,ID3);
  line.id_ = (IDType)testing::Return<BasicTestExpr<2>>(in_stack_fffffffffffc6490.id_);
  BStack_2b124.id_ = line.id_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8);
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::WillOnce
            ((TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>
              *)CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *)
             in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)>::~Action
            ((Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>)> *)
             0x17b1c2);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x17b1cf);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x17b1dc);
  testing::Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x17b1e9);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_2b138,&MStack_2b0b0);
  BasicTestExpr<1>::BasicTestExpr(&BStack_2b13c,ID);
  BasicTestExpr<1>::BasicTestExpr(&BStack_2b140,ID2);
  IStack_2b144 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnRelational
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_
                                            ),in_stack_fffffffffffc648c,
                                    in_stack_fffffffffffc64a0.id_,
                                    (NumericExpr)in_stack_fffffffffffc6498.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_2b138);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  obj = &MStack_2cd90;
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  BasicTestExpr<1>::BasicTestExpr(aBStack_2cdcc,ID);
  testing::Matcher<BasicTestExpr<1>_>::Matcher
            ((Matcher<BasicTestExpr<1>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<1>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  TestCountExpr::TestCountExpr
            ((TestCountExpr *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             in_stack_fffffffffffc648c);
  value_03.id_ = in_stack_fffffffffffc64d4;
  value_03.super_TestNumericExpr.id_ = in_stack_fffffffffffc64d0.id_;
  testing::Matcher<TestCountExpr>::Matcher(in_stack_fffffffffffc64c8,value_03);
  call = MockProblemBuilder::gmock_MakeLogicalCount
                   ((MockProblemBuilder *)
                    CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_),
                    (Matcher<mp::expr::Kind> *)in_stack_fffffffffffc6498,
                    (Matcher<BasicTestExpr<1>_> *)
                    CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
                    (Matcher<TestCountExpr> *)
                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *
                     )this_00,(char *)file,line.id_,(char *)obj,(char *)call);
  BasicTestExpr<2>::BasicTestExpr(&BStack_2ce08,ID3);
  BStack_2ce04.id_ = (IDType)testing::Return<BasicTestExpr<2>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8);
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::WillOnce
            ((TypedExpectation<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *
             )CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
             (Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *)
             in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::~Action
            ((Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *)0x17b3d1)
  ;
  testing::Matcher<TestCountExpr>::~Matcher((Matcher<TestCountExpr> *)0x17b3de);
  testing::Matcher<BasicTestExpr<1>_>::~Matcher((Matcher<BasicTestExpr<1>_> *)0x17b3eb);
  testing::Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x17b3f8);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_2ce18,&MStack_2cd90);
  BasicTestExpr<1>::BasicTestExpr(&BStack_2ce1c,ID);
  TestCountExpr::TestCountExpr
            ((TestCountExpr *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             in_stack_fffffffffffc648c);
  IStack_2ce28 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnLogicalCount
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_
                                            ),in_stack_fffffffffffc648c,
                                    in_stack_fffffffffffc64a0.id_,in_stack_fffffffffffc6498);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_2ce18);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  BasicTestExpr<2>::BasicTestExpr(aBStack_2ea94,ID);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<2>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  BasicTestExpr<2>::BasicTestExpr(aBStack_2eab4,ID2);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<2>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  BasicTestExpr<2>::BasicTestExpr(aBStack_2ead4,ID3);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8,
             (BasicTestExpr<2>)(IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_MakeImplication
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc6498,
             (Matcher<BasicTestExpr<2>_> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
             (Matcher<BasicTestExpr<2>_> *)
             CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::
  MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
                      *)this_00,(char *)file,line.id_,(char *)obj,(char *)call);
  BasicTestExpr<2>::BasicTestExpr(&BStack_2eaf0,ID4);
  BStack_2eaec.id_ = (IDType)testing::Return<BasicTestExpr<2>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8);
  testing::internal::
  TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::
  WillOnce((TypedExpectation<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>
            *)CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)> *)
           in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)>::~Action
            ((Action<BasicTestExpr<2>_(BasicTestExpr<2>,_BasicTestExpr<2>,_BasicTestExpr<2>)> *)
             0x17b5f6);
  testing::Matcher<BasicTestExpr<2>_>::~Matcher((Matcher<BasicTestExpr<2>_> *)0x17b603);
  testing::Matcher<BasicTestExpr<2>_>::~Matcher((Matcher<BasicTestExpr<2>_> *)0x17b610);
  testing::Matcher<BasicTestExpr<2>_>::~Matcher((Matcher<BasicTestExpr<2>_> *)0x17b61d);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_2eb00,&MStack_2ea70);
  BasicTestExpr<2>::BasicTestExpr(&BStack_2eb04,ID);
  BasicTestExpr<2>::BasicTestExpr(&BStack_2eb08,ID2);
  BasicTestExpr<2>::BasicTestExpr(&BStack_2eb0c,ID3);
  IStack_2eb10 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::OnImplication
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_
                                            ),in_stack_fffffffffffc64a0,
                                    (LogicalExpr)in_stack_fffffffffffc6498.id_,
                                    (IDType)in_stack_fffffffffffc6498.super_TestNumericExpr.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_2eb00);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  MockProblemBuilder::gmock_BeginIteratedLogical
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_)
             ,(Matcher<mp::expr::Kind> *)in_stack_fffffffffffc6498,
             (Matcher<int> *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::internal::MockSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::
  InternalExpectedAt((MockSpec<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)
                     this_00,(char *)file,line.id_,(char *)obj,(char *)call);
  TestExprBuilder<4,_BasicTestExpr<2>_>::TestExprBuilder(&TStack_307a8,ID);
  TStack_307a4.id_ =
       (IDType)testing::Return<TestExprBuilder<4,BasicTestExpr<2>>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::
  WillOnce((TypedExpectation<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)
           CONCAT44(in_stack_fffffffffffc6514,in_stack_fffffffffffc6510),
           (Action<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)
           in_stack_fffffffffffc6508);
  testing::Action<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::~Action
            ((Action<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *)0x17b7d2);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x17b7df);
  testing::Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x17b7ec);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_307b8,&MStack_30758);
  IStack_307bc = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginIteratedLogical
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),UNKNOWN,0x17b81a);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_307b8);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  TestExprBuilder<4,_BasicTestExpr<2>_>::TestExprBuilder(aTStack_3242c,ID);
  testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>::Matcher
            ((Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)in_stack_fffffffffffc64b8,
             (TestExprBuilder<4,_BasicTestExpr<2>_>)
             (IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20));
  MockProblemBuilder::gmock_EndIteratedLogical
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)
              CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *)this_00,
                     (char *)file,line.id_,(char *)obj,(char *)call);
  BasicTestExpr<2>::BasicTestExpr(&BStack_32448,ID2);
  BVar1.id_ = (IDType)testing::Return<BasicTestExpr<2>>(in_stack_fffffffffffc6490.id_);
  BStack_32444.id_ = BVar1.id_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::
  WillOnce((TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *)
           CONCAT44(BVar1.id_,in_stack_fffffffffffc6510),in_stack_fffffffffffc6508);
  testing::Action<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)>::~Action
            ((Action<BasicTestExpr<2>_(TestExprBuilder<4,_BasicTestExpr<2>_>)> *)0x17b954);
  testing::Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_>::~Matcher
            ((Matcher<TestExprBuilder<4,_BasicTestExpr<2>_>_> *)0x17b961);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_32458,&MStack_32408);
  TestExprBuilder<4,_BasicTestExpr<2>_>::TestExprBuilder(&TStack_3245c,ID);
  LVar2 = mp::internal::NLProblemBuilder<MockProblemBuilder>::EndIteratedLogical
                    ((NLProblemBuilder<MockProblemBuilder> *)
                     CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_),
                     in_stack_fffffffffffc6490.id_);
  IStack_32460 = LVar2.id_;
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_32458);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  action = &MStack_340a8;
  testing::Matcher<mp::expr::Kind>::Matcher
            ((Matcher<mp::expr::Kind> *)in_stack_fffffffffffc64c0,
             (Kind)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffc64c0,
             (int)((ulong)in_stack_fffffffffffc64b8 >> 0x20));
  value_07.id_ = (IDType)((ulong)in_stack_fffffffffffc64c0 >> 0x20);
  pMVar7 = MockProblemBuilder::gmock_BeginPairwise
                     ((MockProblemBuilder *)
                      CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_),
                      (Matcher<mp::expr::Kind> *)in_stack_fffffffffffc6498,
                      (Matcher<int> *)
                      CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  pTVar8 = testing::internal::MockSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>
           ::InternalExpectedAt
                     ((MockSpec<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
                      this_00,(char *)file,line.id_,(char *)obj,(char *)call);
  TestExprBuilder<5,_BasicTestExpr<1>_>::TestExprBuilder(&TStack_340f8,ID);
  TVar3.id_ = (IDType)testing::Return<TestExprBuilder<5,BasicTestExpr<1>>>
                                (in_stack_fffffffffffc6490.id_);
  TStack_340f4.id_ = TVar3.id_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::
  WillOnce((TypedExpectation<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)
           CONCAT44(BVar1.id_,LVar2.id_),
           (Action<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)action);
  testing::Action<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)>::~Action
            ((Action<TestExprBuilder<5,_BasicTestExpr<1>_>_(mp::expr::Kind,_int)> *)0x17bace);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x17badb);
  testing::Matcher<mp::expr::Kind>::~Matcher((Matcher<mp::expr::Kind> *)0x17bae8);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_34108,&MStack_340a8);
  PVar4 = mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginPairwise
                    ((NLProblemBuilder<MockProblemBuilder> *)
                     CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_),UNKNOWN,
                     0x17bb16);
  IStack_3410c = PVar4.id_;
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_34108);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  TestExprBuilder<5,_BasicTestExpr<1>_>::TestExprBuilder(aTStack_35d7c,ID);
  testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>::Matcher
            ((Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)in_stack_fffffffffffc64b8,value_07);
  MockProblemBuilder::gmock_EndPairwise
            ((MockProblemBuilder *)CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_)
             ,(Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)
              CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  testing::internal::MockSpec<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
  InternalExpectedAt((MockSpec<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *)this_00,
                     (char *)file,line.id_,(char *)obj,(char *)call);
  BasicTestExpr<2>::BasicTestExpr(&BStack_35d98,ID2);
  BStack_35d94.id_ = (IDType)testing::Return<BasicTestExpr<2>>(in_stack_fffffffffffc6490.id_);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<2>_> *)in_stack_fffffffffffc64b8);
  testing::internal::TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
  WillOnce((TypedExpectation<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *)
           CONCAT44(BVar1.id_,LVar2.id_),
           (Action<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *)action);
  testing::Action<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::~Action
            ((Action<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *)0x17bc32);
  testing::Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_>::~Matcher
            ((Matcher<TestExprBuilder<5,_BasicTestExpr<1>_>_> *)0x17bc3f);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_35da8,&MStack_35d58);
  TestExprBuilder<5,_BasicTestExpr<1>_>::TestExprBuilder(&TStack_35dac,ID);
  IStack_35db0 = (IDType)mp::internal::NLProblemBuilder<MockProblemBuilder>::EndPairwise
                                   ((NLProblemBuilder<MockProblemBuilder> *)
                                    CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_
                                            ),in_stack_fffffffffffc6490.id_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_35da8);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc64b4,in_stack_fffffffffffc64b0));
  uStack_37a28 = local_18;
  uStack_37a20 = uStack_10;
  value_06.size_ = (size_t)pMVar7;
  value_06.data_ = (char *)pTVar8;
  testing::Matcher<fmt::BasicStringRef<char>_>::Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)CONCAT44(TVar3.id_,PVar4.id_),value_06);
  pMVar9 = MockProblemBuilder::gmock_MakeStringLiteral
                     ((MockProblemBuilder *)
                      CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
                      (Matcher<fmt::BasicStringRef<char>_> *)
                      CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  value_08.id_ = (IDType)((ulong)pMVar9 >> 0x20);
  this_01 = testing::internal::MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::
            InternalExpectedAt((MockSpec<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)this_00,
                               (char *)file,line.id_,(char *)obj,(char *)call);
  BasicTestExpr<0>::BasicTestExpr(&BStack_37a40,ID);
  BVar5.id_ = (IDType)testing::Return<BasicTestExpr<0>>(in_stack_fffffffffffc6490);
  BStack_37a3c.id_ = BVar5.id_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<0>_> *)this_01);
  testing::internal::TypedExpectation<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::WillOnce
            ((TypedExpectation<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)
             CONCAT44(BVar1.id_,LVar2.id_),
             (Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)action);
  testing::Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)>::~Action
            ((Action<BasicTestExpr<0>_(fmt::BasicStringRef<char>)> *)0x17bd9f);
  testing::Matcher<fmt::BasicStringRef<char>_>::~Matcher
            ((Matcher<fmt::BasicStringRef<char>_> *)0x17bdac);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_37a50,&MStack_379f8);
  uStack_37a68 = local_18;
  uStack_37a60 = uStack_10;
  value_02.data_._4_4_ = in_stack_fffffffffffc64a4;
  value_02.data_._0_4_ = in_stack_fffffffffffc64a0.id_;
  value_02.size_ = in_stack_fffffffffffc64a8;
  EVar6 = mp::internal::NLProblemBuilder<MockProblemBuilder>::OnString
                    ((NLProblemBuilder<MockProblemBuilder> *)in_stack_fffffffffffc6498,value_02);
  IStack_37a6c = EVar6.id_;
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_37a50);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)
             CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_));
  testing::StrictMock<MockProblemBuilder>::StrictMock
            ((StrictMock<MockProblemBuilder> *)CONCAT44(BVar5.id_,EVar6.id_));
  BasicTestExpr<2>::BasicTestExpr(aBStack_396dc,ID);
  testing::Matcher<BasicTestExpr<2>_>::Matcher
            ((Matcher<BasicTestExpr<2>_> *)this_01,(BasicTestExpr<2>)value_08.id_);
  BasicTestExpr<0>::BasicTestExpr(aBStack_396fc,ID2);
  testing::Matcher<BasicTestExpr<0>_>::Matcher((Matcher<BasicTestExpr<0>_> *)this_01,value_08);
  BasicTestExpr<0>::BasicTestExpr(aBStack_3971c,ID3);
  testing::Matcher<BasicTestExpr<0>_>::Matcher((Matcher<BasicTestExpr<0>_> *)this_01,value_08);
  pMVar10 = MockProblemBuilder::gmock_MakeSymbolicIf
                      ((MockProblemBuilder *)
                       CONCAT44(in_stack_fffffffffffc64a4,in_stack_fffffffffffc64a0.id_),
                       (Matcher<BasicTestExpr<2>_> *)in_stack_fffffffffffc6498,
                       (Matcher<BasicTestExpr<0>_> *)
                       CONCAT44(in_stack_fffffffffffc6494,in_stack_fffffffffffc6490.id_),
                       (Matcher<BasicTestExpr<0>_> *)
                       CONCAT44(in_stack_fffffffffffc648c,in_stack_fffffffffffc6488.id_));
  condition.id_ = (IDType)pMVar10;
  pTVar11 = testing::internal::
            MockSpec<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::
            InternalExpectedAt((MockSpec<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
                                *)this_00,(char *)file,line.id_,(char *)obj,(char *)call);
  BasicTestExpr<0>::BasicTestExpr(&BStack_39738,ID4);
  BVar5.id_ = (IDType)testing::Return<BasicTestExpr<0>>(in_stack_fffffffffffc6490);
  BStack_39734.id_ = BVar5.id_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<0>_> *)this_01);
  testing::internal::
  TypedExpectation<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::
  WillOnce((TypedExpectation<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>
            *)CONCAT44(BVar1.id_,LVar2.id_),
           (Action<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *)action
          );
  testing::Action<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)>::~Action
            ((Action<BasicTestExpr<0>_(BasicTestExpr<2>,_BasicTestExpr<0>,_BasicTestExpr<0>)> *)
             0x17bf70);
  testing::Matcher<BasicTestExpr<0>_>::~Matcher((Matcher<BasicTestExpr<0>_> *)0x17bf7d);
  testing::Matcher<BasicTestExpr<0>_>::~Matcher((Matcher<BasicTestExpr<0>_> *)0x17bf8a);
  testing::Matcher<BasicTestExpr<2>_>::~Matcher((Matcher<BasicTestExpr<2>_> *)0x17bf97);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::NLProblemBuilder(&NStack_39748,&MStack_396b8);
  BasicTestExpr<2>::BasicTestExpr(&BStack_3974c,ID);
  BasicTestExpr<0>::BasicTestExpr(&BStack_39750,ID2);
  BasicTestExpr<0>::BasicTestExpr(&BStack_39754,ID3);
  EVar6 = mp::internal::NLProblemBuilder<MockProblemBuilder>::OnSymbolicIf
                    ((NLProblemBuilder<MockProblemBuilder> *)
                     CONCAT44(BVar5.id_,in_stack_fffffffffffc6490.id_),condition,
                     (IDType)((ulong)pTVar11 >> 0x20),(IDType)pTVar11);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::~NLProblemBuilder(&NStack_39748);
  testing::StrictMock<MockProblemBuilder>::~StrictMock
            ((StrictMock<MockProblemBuilder> *)CONCAT44(BVar5.id_,EVar6.id_));
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, Forward) {
  // Use the same StringRef object in arguments, because StringRef objects
  // are compared as pointers and string literals they point to may not
  // be merged.
  fmt::StringRef str("foo");
  EXPECT_FORWARD_RET(OnIntSuffix, AddIntSuffix, (str, mp::suf::OBJ, 11),
                     TestSuffixHandler<0>(ID));
  EXPECT_FORWARD_RET(OnDblSuffix, AddDblSuffix, (str, mp::suf::OBJ, 11),
                     TestSuffixHandler<1>(ID));

  EXPECT_FORWARD_RET(OnNumber, MakeNumericConstant,
                     (2.2), TestNumericExpr(ID));
  EXPECT_FORWARD_RET(OnVariableRef, MakeVariable, (33), TestReference(ID));
  EXPECT_FORWARD_RET(OnCommonExprRef, MakeCommonExpr, (33), TestReference(ID));
  EXPECT_FORWARD_RET(OnUnary, MakeUnary, (expr::ABS, TestNumericExpr(ID)),
                     TestNumericExpr(ID2));
  EXPECT_FORWARD_RET(OnBinary, MakeBinary,
                     (expr::ADD, TestNumericExpr(ID), TestNumericExpr(ID2)),
                     TestNumericExpr(ID3));
  EXPECT_FORWARD_RET(OnIf, MakeIf,
                     (TestLogicalExpr(ID), TestNumericExpr(ID2),
                      TestNumericExpr(ID3)), TestNumericExpr(ID4));

  EXPECT_FORWARD_RET(BeginPLTerm, BeginPLTerm, (44), TestPLTermBuilder(ID));
  EXPECT_FORWARD_RET(EndPLTerm, EndPLTerm,
                     (TestPLTermBuilder(ID), TestReference(ID2)),
                     TestNumericExpr(ID3));

  EXPECT_FORWARD_RET(BeginVarArg, BeginIterated, (expr::MAX, 77),
                     TestIteratedExprBuilder(ID));
  EXPECT_FORWARD_RET(EndVarArg, EndIterated, (TestIteratedExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginSum, BeginSum, (88),
                     TestIteratedExprBuilder(ID));
  EXPECT_FORWARD_RET(EndSum, EndSum, (TestIteratedExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginNumberOf, BeginNumberOf, (11, TestNumericExpr(ID)),
                     TestNumberOfExprBuilder(ID2));
  EXPECT_FORWARD_RET(EndNumberOf, EndNumberOf, (TestNumberOfExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginSymbolicNumberOf, BeginSymbolicNumberOf,
                     (11, TestExpr(ID)), TestSymbolicNumberOfExprBuilder(ID2));
  EXPECT_FORWARD_RET(EndSymbolicNumberOf, EndSymbolicNumberOf,
                     (TestSymbolicNumberOfExprBuilder(ID)),
                     TestNumericExpr(ID2));

  EXPECT_FORWARD_RET(BeginCount, BeginCount, (99), TestCountExprBuilder(ID));
  EXPECT_FORWARD_RET(EndCount, EndCount, (TestCountExprBuilder(ID)),
                     TestCountExpr(ID2));

  EXPECT_FORWARD_RET(OnBool, MakeLogicalConstant, (true), TestLogicalExpr(ID));
  EXPECT_FORWARD_RET(OnNot, MakeNot, (TestLogicalExpr(ID)),
                     TestLogicalExpr(ID2));
  EXPECT_FORWARD_RET(OnBinaryLogical, MakeBinaryLogical,
                     (expr::OR, TestLogicalExpr(ID), TestLogicalExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnRelational, MakeRelational,
                     (expr::LT, TestNumericExpr(ID), TestNumericExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnLogicalCount, MakeLogicalCount,
                     (expr::ATLEAST, TestNumericExpr(ID), TestCountExpr(ID2)),
                     TestLogicalExpr(ID3));
  EXPECT_FORWARD_RET(OnImplication, MakeImplication,
                     (TestLogicalExpr(ID), TestLogicalExpr(ID2),
                      TestLogicalExpr(ID3)), TestLogicalExpr(ID4));

  EXPECT_FORWARD_RET(BeginIteratedLogical, BeginIteratedLogical,
                     (expr::EXISTS, 22), TestIteratedLogicalExprBuilder(ID));
  EXPECT_FORWARD_RET(EndIteratedLogical, EndIteratedLogical,
                     (TestIteratedLogicalExprBuilder(ID)),
                     TestLogicalExpr(ID2));

  EXPECT_FORWARD_RET(BeginPairwise, BeginPairwise, (expr::ALLDIFF, 33),
                     TestPairwiseExprBuilder(ID));
  EXPECT_FORWARD_RET(EndPairwise, EndPairwise,
                     (TestPairwiseExprBuilder(ID)), TestLogicalExpr(ID2));

  EXPECT_FORWARD_RET(OnString, MakeStringLiteral, (str), TestExpr(ID));

  EXPECT_FORWARD_RET(OnSymbolicIf, MakeSymbolicIf,
                     (TestLogicalExpr(ID), TestExpr(ID2), TestExpr(ID3)),
                     TestExpr(ID4));
}